

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_BRAND_AMMO(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  char *local_48;
  char *brand;
  _Bool used;
  wchar_t itemmode;
  char *s;
  char *q;
  object *obj;
  effect_handler_context_t_conflict *context_local;
  
  obj = (object *)context;
  uVar2 = Rand_div(3);
  if (uVar2 == 0) {
    local_48 = "Flame";
  }
  else {
    uVar2 = Rand_div(2);
    local_48 = "Venom";
    if (uVar2 == 0) {
      local_48 = "Frost";
    }
  }
  *(undefined1 *)(obj->modifiers + 7) = 1;
  if (*(long *)(obj->modifiers + 0xb) == 0) {
    _Var1 = get_item((object **)&q,"Brand which kind of ammunition? ","You have nothing to brand.",
                     CMD_NULL,tval_is_ammo,L'\x0e');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar3 = cmd_get_item(*(command **)(obj->modifiers + 0xb),"tgtitem",(object **)&q,
                         "Brand which kind of ammunition? ","You have nothing to brand.",
                         tval_is_ammo,L'\x0e');
    if (wVar3 != L'\0') {
      return false;
    }
  }
  brand_object((object *)q,local_48);
  return true;
}

Assistant:

bool effect_handler_BRAND_AMMO(effect_handler_context_t *context)
{
	struct object *obj;
	const char *q, *s;
	int itemmode = (USE_INVEN | USE_QUIVER | USE_FLOOR);
	bool used = false;

	/* Select the brand */
	const char *brand = one_in_(3) ? "Flame" : (one_in_(2) ? "Frost" : "Venom");

	context->ident = true;

	/* Get an item */
	q = "Brand which kind of ammunition? ";
	s = "You have nothing to brand.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_is_ammo, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_is_ammo, itemmode))
		return used;

	/* Brand the ammo */
	brand_object(obj, brand);

	/* Done */
	return (true);
}